

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

DropIndicatorPosition __thiscall
QAbstractItemViewPrivate::position
          (QAbstractItemViewPrivate *this,QPoint *pos,QRect *rect,QModelIndex *index)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  ulong uVar5;
  undefined8 in_RCX;
  QPoint *in_RDX;
  bool in_SIL;
  long in_RDI;
  long in_FS_OFFSET;
  int margin;
  DropIndicatorPosition r;
  QRect touchingRect;
  undefined4 in_stack_ffffffffffffff78;
  ItemFlag in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int in_stack_ffffffffffffffa0;
  DropIndicatorPosition DVar6;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_28;
  undefined8 local_24;
  undefined8 local_1c;
  undefined4 local_14;
  int local_10;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  DVar6 = OnViewport;
  if ((*(byte *)(in_RDI + 0x3e4) & 1) == 0) {
    local_c = 2;
    QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    local_10 = qRound(4.15926891249483e-317);
    local_14 = 0xc;
    piVar4 = qBound<int>((int *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                         (int *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                         (int *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    in_stack_ffffffffffffffa0 = *piVar4;
    iVar2 = QPoint::y((QPoint *)0x8074c6);
    iVar3 = QRect::top((QRect *)0x8074d4);
    if (iVar2 - iVar3 < in_stack_ffffffffffffffa0) {
      DVar6 = AboveItem;
    }
    else {
      iVar2 = QRect::bottom((QRect *)0x8074f6);
      iVar3 = QPoint::y((QPoint *)0x807504);
      if (iVar2 - iVar3 < in_stack_ffffffffffffffa0) {
        DVar6 = BelowItem;
      }
      else {
        uVar5 = QRect::contains(in_RDX,in_SIL);
        if ((uVar5 & 1) != 0) {
          DVar6 = OnItem;
        }
      }
    }
  }
  else {
    local_24 = *(undefined8 *)in_RDX;
    local_1c = *(undefined8 *)(in_RDX + 8);
    QRect::adjust((QRect *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                  in_stack_ffffffffffffff80);
    uVar5 = QRect::contains((QPoint *)&local_24,in_SIL);
    if ((uVar5 & 1) != 0) {
      DVar6 = OnItem;
    }
  }
  bVar1 = false;
  if (DVar6 == OnItem) {
    (**(code **)(**(long **)(in_RDI + 0x2f8) + 0x138))(*(long **)(in_RDI + 0x2f8),in_RCX);
    local_28.super_QFlagsStorage<Qt::ItemFlag>.i =
         (QFlagsStorage<Qt::ItemFlag>)
         QFlags<Qt::ItemFlag>::operator&
                   ((QFlags<Qt::ItemFlag> *)
                    CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                    in_stack_ffffffffffffff7c);
    bVar1 = QFlags<Qt::ItemFlag>::operator!((QFlags<Qt::ItemFlag> *)&local_28);
  }
  if (bVar1 != false) {
    iVar2 = QPoint::y((QPoint *)0x80760d);
    QRect::center((QRect *)CONCAT44(DVar6,in_stack_ffffffffffffffa0));
    iVar3 = QPoint::y((QPoint *)0x80762a);
    DVar6 = BelowItem;
    if (iVar2 < iVar3) {
      DVar6 = AboveItem;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return DVar6;
}

Assistant:

QAbstractItemView::DropIndicatorPosition
QAbstractItemViewPrivate::position(const QPoint &pos, const QRect &rect, const QModelIndex &index) const
{
    QAbstractItemView::DropIndicatorPosition r = QAbstractItemView::OnViewport;
    if (!overwrite) {
        const int margin = qBound(2, qRound(qreal(rect.height()) / 5.5), 12);
        if (pos.y() - rect.top() < margin) {
            r = QAbstractItemView::AboveItem;
        } else if (rect.bottom() - pos.y() < margin) {
            r = QAbstractItemView::BelowItem;
        } else if (rect.contains(pos, true)) {
            r = QAbstractItemView::OnItem;
        }
    } else {
        QRect touchingRect = rect;
        touchingRect.adjust(-1, -1, 1, 1);
        if (touchingRect.contains(pos, false)) {
            r = QAbstractItemView::OnItem;
        }
    }

    if (r == QAbstractItemView::OnItem && (!(model->flags(index) & Qt::ItemIsDropEnabled)))
        r = pos.y() < rect.center().y() ? QAbstractItemView::AboveItem : QAbstractItemView::BelowItem;

    return r;
}